

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int jsonEachColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int i)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  sqlite3_vtab *psVar4;
  size_t sVar5;
  sqlite3_value **aReplace;
  int *piVar6;
  JsonNode *pNode;
  JsonString x;
  
  if (8 < (uint)i) {
LAB_001c1e29:
    psVar4 = (sqlite3_vtab *)"$";
    if (cur[5].pVtab != (sqlite3_vtab *)0x0) {
      psVar4 = cur[5].pVtab;
    }
    goto LAB_001c1eb9;
  }
  uVar2 = *(uint *)&cur[2].pVtab;
  uVar3 = (ulong)uVar2;
  pNode = (JsonNode *)(&(cur[7].pVtab)->pModule + uVar3 * 2);
  aReplace = (sqlite3_value **)
             ((long)&switchD_001c1d72::switchdataD_001dc32c +
             (long)(int)(&switchD_001c1d72::switchdataD_001dc32c)[(uint)i]);
  x.pCtx = ctx;
  switch(i) {
  case 0:
    if (uVar3 == 0) {
      return 0;
    }
    bVar1 = *(byte *)&cur[3].pVtab;
    aReplace = (sqlite3_value **)(ulong)bVar1;
    if (bVar1 == 6) {
      piVar6 = (int *)(cur + 1);
      if (*(char *)((long)&cur[3].pVtab + 1) != '\0') {
        if (*piVar6 == 0) {
          return 0;
        }
        piVar6 = &(cur[7].pVtab)->nRef +
                 (ulong)*(uint *)((long)&(cur[9].pVtab)->pModule + uVar3 * 4) * 4;
      }
      uVar3 = (ulong)(uint)*piVar6;
      goto LAB_001c1f11;
    }
    if (bVar1 != 7) {
      return 0;
    }
    break;
  case 1:
    pNode = (JsonNode *)(&pNode->eType + (pNode->jnFlags >> 2 & 0x10));
    break;
  case 2:
    psVar4 = (sqlite3_vtab *)jsonType[(&pNode->eType)[pNode->jnFlags >> 2 & 0x10]];
    goto LAB_001c1eb9;
  case 3:
    uVar2 = pNode->jnFlags >> 2 & 0x10;
    if (5 < (&pNode->eType)[uVar2]) {
      return 0;
    }
    pNode = (JsonNode *)(&pNode->eType + uVar2);
    break;
  case 4:
    uVar3 = uVar3 + ((pNode->jnFlags >> 6 & 1) != 0);
    goto LAB_001c1f11;
  case 5:
    if (uVar2 <= *(uint *)((long)&cur[1].pVtab + 4)) {
      return 0;
    }
    if (*(char *)((long)&cur[3].pVtab + 1) == '\0') {
      return 0;
    }
    uVar3 = (ulong)*(uint *)((long)&(cur[9].pVtab)->pModule + uVar3 * 4);
LAB_001c1f11:
    sqlite3_result_int64(ctx,uVar3);
    return 0;
  case 6:
    x.zBuf = x.zSpace;
    x.nAlloc = 100;
    x.nUsed = 0;
    x.bStatic = '\x01';
    x.bErr = '\0';
    if (*(char *)((long)&cur[3].pVtab + 1) == '\0') {
      psVar4 = cur[5].pVtab;
      if (psVar4 == (sqlite3_vtab *)0x0) {
        jsonAppendChar(&x,'$');
      }
      else {
        sVar5 = strlen((char *)psVar4);
        jsonAppendRaw(&x,(char *)psVar4,(u32)sVar5);
      }
      if (*(char *)&cur[3].pVtab == '\a') {
        jsonAppendObjectPathElement(&x,pNode);
      }
      else if (*(char *)&cur[3].pVtab == '\x06') {
        jsonPrintf(0x1e,&x,"[%d]",(ulong)*(uint *)&cur[1].pVtab);
      }
    }
    else {
      jsonEachComputePath((JsonEachCursor *)cur,&x,uVar2);
    }
LAB_001c1eae:
    jsonResult(&x);
    return 0;
  case 7:
    if (*(char *)((long)&cur[3].pVtab + 1) != '\0') {
      x.zBuf = x.zSpace;
      x.nAlloc = 100;
      x.nUsed = 0;
      x.bStatic = '\x01';
      x.bErr = '\0';
      jsonEachComputePath((JsonEachCursor *)cur,&x,
                          *(u32 *)((long)&(cur[9].pVtab)->pModule + uVar3 * 4));
      goto LAB_001c1eae;
    }
    goto LAB_001c1e29;
  case 8:
    psVar4 = cur[8].pVtab;
LAB_001c1eb9:
    sqlite3_result_text(ctx,(char *)psVar4,-1,(_func_void_void_ptr *)0x0);
    return 0;
  }
  jsonReturn(pNode,ctx,aReplace);
  return 0;
}

Assistant:

static int jsonEachColumn(
  sqlite3_vtab_cursor *cur,   /* The cursor */
  sqlite3_context *ctx,       /* First argument to sqlite3_result_...() */
  int i                       /* Which column to return */
){
  JsonEachCursor *p = (JsonEachCursor*)cur;
  JsonNode *pThis = &p->sParse.aNode[p->i];
  switch( i ){
    case JEACH_KEY: {
      if( p->i==0 ) break;
      if( p->eType==JSON_OBJECT ){
        jsonReturn(pThis, ctx, 0);
      }else if( p->eType==JSON_ARRAY ){
        u32 iKey;
        if( p->bRecursive ){
          if( p->iRowid==0 ) break;
          assert( p->sParse.aNode[p->sParse.aUp[p->i]].eU==3 );
          iKey = p->sParse.aNode[p->sParse.aUp[p->i]].u.iKey;
        }else{
          iKey = p->iRowid;
        }
        sqlite3_result_int64(ctx, (sqlite3_int64)iKey);
      }
      break;
    }
    case JEACH_VALUE: {
      if( pThis->jnFlags & JNODE_LABEL ) pThis++;
      jsonReturn(pThis, ctx, 0);
      break;
    }
    case JEACH_TYPE: {
      if( pThis->jnFlags & JNODE_LABEL ) pThis++;
      sqlite3_result_text(ctx, jsonType[pThis->eType], -1, SQLITE_STATIC);
      break;
    }
    case JEACH_ATOM: {
      if( pThis->jnFlags & JNODE_LABEL ) pThis++;
      if( pThis->eType>=JSON_ARRAY ) break;
      jsonReturn(pThis, ctx, 0);
      break;
    }
    case JEACH_ID: {
      sqlite3_result_int64(ctx,
         (sqlite3_int64)p->i + ((pThis->jnFlags & JNODE_LABEL)!=0));
      break;
    }
    case JEACH_PARENT: {
      if( p->i>p->iBegin && p->bRecursive ){
        sqlite3_result_int64(ctx, (sqlite3_int64)p->sParse.aUp[p->i]);
      }
      break;
    }
    case JEACH_FULLKEY: {
      JsonString x;
      jsonInit(&x, ctx);
      if( p->bRecursive ){
        jsonEachComputePath(p, &x, p->i);
      }else{
        if( p->zRoot ){
          jsonAppendRaw(&x, p->zRoot, (int)strlen(p->zRoot));
        }else{
          jsonAppendChar(&x, '$');
        }
        if( p->eType==JSON_ARRAY ){
          jsonPrintf(30, &x, "[%d]", p->iRowid);
        }else if( p->eType==JSON_OBJECT ){
          jsonAppendObjectPathElement(&x, pThis);
        }
      }
      jsonResult(&x);
      break;
    }
    case JEACH_PATH: {
      if( p->bRecursive ){
        JsonString x;
        jsonInit(&x, ctx);
        jsonEachComputePath(p, &x, p->sParse.aUp[p->i]);
        jsonResult(&x);
        break;
      }
      /* For json_each() path and root are the same so fall through
      ** into the root case */
      /* no break */ deliberate_fall_through
    }
    default: {
      const char *zRoot = p->zRoot;
      if( zRoot==0 ) zRoot = "$";
      sqlite3_result_text(ctx, zRoot, -1, SQLITE_STATIC);
      break;
    }
    case JEACH_JSON: {
      assert( i==JEACH_JSON );
      sqlite3_result_text(ctx, p->sParse.zJson, -1, SQLITE_STATIC);
      break;
    }
  }
  return SQLITE_OK;
}